

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O3

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::AddDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  element_type *peVar3;
  lu_byte *plVar4;
  element_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  lu_byte *plVar5;
  shared_ptr<Debugger> sVar6;
  lua_State *mainState;
  undefined1 local_59;
  pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_> local_58;
  element_type *local_40;
  EmmyDebuggerManager *local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&L->hook);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (luaVersion == LUA_JIT) {
    peVar3 = (element_type *)0x0;
  }
  else {
    peVar3 = (element_type *)GetMainState((lua_State *)in_RDX);
  }
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar4 = (lu_byte *)L[1].top.offset;
  if (plVar4 != (lu_byte *)0x0) {
    plVar5 = &L[1].tt;
    do {
      if ((element_type *)((StkIdRel *)(plVar4 + 0x20))->p >= peVar3) {
        plVar5 = plVar4;
      }
      plVar4 = *(lu_byte **)
                (plVar4 + (ulong)((element_type *)((StkIdRel *)(plVar4 + 0x20))->p < peVar3) * 8 +
                          0x10);
    } while (plVar4 != (lu_byte *)0x0);
    if ((plVar5 != &L[1].tt) && ((element_type *)((StkIdRel *)(plVar5 + 0x20))->p <= peVar3)) {
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*(StkIdRel *)(plVar5 + 0x28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar5 + 0x30));
      goto LAB_0014a4fe;
    }
  }
  local_38 = (EmmyDebuggerManager *)L;
  if (luaVersion == LUA_JIT) {
    local_40 = (element_type *)0x0;
    iVar2 = (*lua_pushthread)((lua_State *)in_RDX);
    (*lua_settop)((lua_State *)in_RDX,-2);
    if (iVar2 == 1) {
      local_40 = in_RDX;
    }
    std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<Debugger>,lua_State*&,EmmyDebuggerManager*>
              ((__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (allocator<Debugger> *)&local_59,(lua_State **)&local_40,&local_38);
  }
  else {
    local_40 = peVar3;
    std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<Debugger>,lua_State*,EmmyDebuggerManager*>
              ((__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (allocator<Debugger> *)&local_59,(lua_State **)&local_40,&local_38);
  }
  local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58.first;
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58.first;
  if ((element_type *)
      local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(((element_type *)
                 local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->super_enable_shared_from_this<Debugger>)._M_weak_this.
                super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(((element_type *)
                 local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->super_enable_shared_from_this<Debugger>)._M_weak_this.
                super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  local_58.first = (unsigned_long_long)peVar3;
  std::
  _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
  ::_M_insert_unique<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>
            ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
              *)(L + 1),&local_58);
  if ((element_type *)
      local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_0014a4fe:
  Debugger::SetCurrentState
            ((Debugger *)
             (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(lua_State *)in_RDX);
  pthread_mutex_unlock((pthread_mutex_t *)&L->hook);
  sVar6.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Debugger>)sVar6.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::AddDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);

	auto identify = GetUniqueIdentify(L);

	std::shared_ptr<Debugger> debugger = nullptr;

	auto it = debuggers.find(identify);

	if (it == debuggers.end())
	{
		if (luaVersion != LuaVersion::LUA_JIT)
		{
			debugger = std::make_shared<Debugger>(reinterpret_cast<lua_State*>(identify), this);
		}
		else
		{
			// 如果首次add 的state不是main state，则main state视为空指针
			// 但不影响luajit附加调试和远程调试
			lua_State* mainState = nullptr;

			int ret = lua_pushthread(L);
			lua_pop(L, 1);
			if (ret == 1)
			{
				mainState = L;
			}

			debugger = std::make_shared<Debugger>(mainState, this);
		}
		debuggers.insert({identify, debugger});
	}
	else
	{
		debugger = it->second;
	}

	debugger->SetCurrentState(L);
	return debugger;
}